

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-pool.c
# Opt level: O0

MMDB_entry_data_list_s * data_pool_alloc(MMDB_data_pool_s *pool)

{
  size_t sVar1;
  _Bool _Var2;
  size_t m;
  MMDB_entry_data_list_s *pMVar3;
  MMDB_entry_data_list_s *element;
  size_t new_size;
  size_t new_index;
  MMDB_entry_data_list_s *element_1;
  MMDB_data_pool_s *pool_local;
  
  if (pool == (MMDB_data_pool_s *)0x0) {
    pool_local = (MMDB_data_pool_s *)0x0;
  }
  else if (pool->used < pool->size) {
    pool_local = (MMDB_data_pool_s *)(pool->block + pool->used);
    pool->used = pool->used + 1;
  }
  else {
    sVar1 = pool->index;
    if (sVar1 + 1 == 0x20) {
      pool_local = (MMDB_data_pool_s *)0x0;
    }
    else {
      _Var2 = can_multiply(0xffffffffffffffff,pool->size,2);
      if (_Var2) {
        m = pool->size << 1;
        _Var2 = can_multiply(0xffffffffffffffff,m,0x40);
        if (_Var2) {
          pMVar3 = (MMDB_entry_data_list_s *)calloc(m,0x40);
          pool->blocks[sVar1 + 1] = pMVar3;
          if (pool->blocks[sVar1 + 1] == (MMDB_entry_data_list_s *)0x0) {
            pool_local = (MMDB_data_pool_s *)0x0;
          }
          else {
            pool->blocks[sVar1 + 1]->pool = pool;
            pool->index = sVar1 + 1;
            pool->block = pool->blocks[pool->index];
            pool->size = m;
            pool->sizes[pool->index] = pool->size;
            pool_local = (MMDB_data_pool_s *)pool->block;
            pool->used = 1;
          }
        }
        else {
          pool_local = (MMDB_data_pool_s *)0x0;
        }
      }
      else {
        pool_local = (MMDB_data_pool_s *)0x0;
      }
    }
  }
  return (MMDB_entry_data_list_s *)pool_local;
}

Assistant:

MMDB_entry_data_list_s *data_pool_alloc(MMDB_data_pool_s *const pool) {
    if (!pool) {
        return NULL;
    }

    if (pool->used < pool->size) {
        MMDB_entry_data_list_s *const element = pool->block + pool->used;
        pool->used++;
        return element;
    }

    // Take it from a new block of memory.

    size_t const new_index = pool->index + 1;
    if (new_index == DATA_POOL_NUM_BLOCKS) {
        // See the comment about not growing this on DATA_POOL_NUM_BLOCKS.
        return NULL;
    }

    if (!can_multiply(SIZE_MAX, pool->size, 2)) {
        return NULL;
    }
    size_t const new_size = pool->size * 2;

    if (!can_multiply(SIZE_MAX, new_size, sizeof(MMDB_entry_data_list_s))) {
        return NULL;
    }
    pool->blocks[new_index] = calloc(new_size, sizeof(MMDB_entry_data_list_s));
    if (!pool->blocks[new_index]) {
        return NULL;
    }

    // We don't need to set this, but it's useful for introspection in tests.
    pool->blocks[new_index]->pool = pool;

    pool->index = new_index;
    pool->block = pool->blocks[pool->index];

    pool->size = new_size;
    pool->sizes[pool->index] = pool->size;

    MMDB_entry_data_list_s *const element = pool->block;
    pool->used = 1;
    return element;
}